

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O3

char * GetID(char **p)

{
  int iVar1;
  char *pcVar2;
  byte bVar3;
  uint uVar4;
  byte *pbVar5;
  
  pbVar5 = (byte *)*p;
  bVar3 = *pbVar5;
  while ((byte)(bVar3 - 1) < 0x20) {
    pbVar5 = pbVar5 + 1;
    *p = (char *)pbVar5;
    bVar3 = *pbVar5;
  }
  if (bVar3 != 0) {
    iVar1 = isalpha((uint)bVar3);
    if (((iVar1 != 0) || (bVar3 == 0x5f)) || (bVar3 == 0x2e)) {
      pcVar2 = nidtemp;
      while( true ) {
        iVar1 = isalnum((uint)bVar3);
        if ((iVar1 == 0) &&
           ((uVar4 = bVar3 - 0x21, 0x3e < uVar4 ||
            ((0x40000000c0002005U >> ((ulong)uVar4 & 0x3f) & 1) == 0)))) break;
        *p = (char *)(pbVar5 + 1);
        *pcVar2 = *pbVar5;
        pcVar2 = (char *)((byte *)pcVar2 + 1);
        pbVar5 = (byte *)*p;
        bVar3 = *pbVar5;
      }
      *pcVar2 = 0;
      return nidtemp;
    }
  }
  return (char *)0x0;
}

Assistant:

char* GetID(char*& p) {
	char* np = nidtemp;
	if (SkipBlanks(p) || (!isLabelStart(p, false) && *p != '.')) return nullptr;
	while (islabchar((byte)*p)) *np++ = *p++;
	*np = 0;
	return nidtemp;
}